

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_plt_char_int(char *char_string,REF_INT max,REF_INT *n,REF_INT *int_string)

{
  ulong uVar1;
  
  *n = 0;
  if (0 < max) {
    uVar1 = 0;
    do {
      int_string[uVar1] = (int)char_string[uVar1];
      *n = *n + 1;
      if (int_string[uVar1] == 0) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)max != uVar1);
  }
  return 7;
}

Assistant:

REF_FCN REF_STATUS ref_gather_plt_char_int(const char *char_string, REF_INT max,
                                           REF_INT *n, REF_INT *int_string) {
  REF_INT i;
  *n = 0;
  for (i = 0; i < max; i++) {
    int_string[i] = (REF_INT)char_string[i];
    (*n)++;
    if (0 == int_string[i]) return REF_SUCCESS;
  }
  return REF_INCREASE_LIMIT;
}